

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsics.cpp
# Opt level: O2

TestCaseGroup * vkt::sparse::createSparseResourcesShaderIntrinsicsTests(TestContext *testCtx)

{
  TextureFormat *format;
  ImageType imageType;
  int iVar1;
  TestCaseGroup *pTVar2;
  ostream *poVar3;
  TestNode *pTVar4;
  ImageType imageType_00;
  TextureFormat *format_00;
  ImageParameters *pIVar5;
  long lVar6;
  long lVar7;
  UVec3 imageSize;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageTypeGroup;
  string local_1f0;
  long local_1d0;
  string *local_1c8;
  long local_1c0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  ostringstream stream;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"shader_intrinsics","Sparse Resources Shader Intrinsics");
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar2;
  if (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::imageParametersArray == '\0') {
    iVar1 = __cxa_guard_acquire(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                                 imageParametersArray);
    if (iVar1 != 0) {
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageType = IMAGE_TYPE_2D;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[0].m_data[0] =
           0x200;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[0].m_data[1] =
           0x100;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[0].m_data[2] =
           1;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[1].m_data[0] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[1].m_data[1] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[1].m_data[2] =
           1;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[2].m_data[0] =
           0x1f7;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[2].m_data[1] =
           0x89;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[2].m_data[2] =
           1;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[3].m_data[0] =
           0xb;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[3].m_data[1] =
           0x25;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes[3].m_data[2] =
           1;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageType =
           IMAGE_TYPE_2D_ARRAY;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[0].m_data[0] =
           0x200;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[0].m_data[1] =
           0x100;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[0].m_data[2] =
           6;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[1].m_data[0] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[1].m_data[1] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[1].m_data[2] =
           8;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[2].m_data[0] =
           0x1f7;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[2].m_data[1] =
           0x89;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[2].m_data[2] =
           3;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[3].m_data[0] =
           0xb;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[3].m_data[1] =
           0x25;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes[3].m_data[2] =
           3;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageType =
           IMAGE_TYPE_CUBE;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[0].m_data[0] =
           0x100;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[0].m_data[1] =
           0x100;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[0].m_data[2] =
           1;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[1].m_data[0] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[1].m_data[1] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[1].m_data[2] =
           1;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[2].m_data[0] =
           0x89;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[2].m_data[1] =
           0x89;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[2].m_data[2] =
           1;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[3].m_data[0] =
           0xb;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[3].m_data[1] =
           0xb;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes[3].m_data[2] =
           1;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageType =
           IMAGE_TYPE_CUBE_ARRAY;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[0].m_data[0] =
           0x100;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[0].m_data[1] =
           0x100;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[0].m_data[2] =
           6;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[1].m_data[0] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[1].m_data[1] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[1].m_data[2] =
           8;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[2].m_data[0] =
           0x89;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[2].m_data[1] =
           0x89;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[2].m_data[2] =
           3;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[3].m_data[0] =
           0xb;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[3].m_data[1] =
           0xb;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes[3].m_data[2] =
           3;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageType = IMAGE_TYPE_3D;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[0].m_data[0] =
           0x100;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[0].m_data[1] =
           0x100;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[0].m_data[2] =
           0x10;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[1].m_data[0] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[1].m_data[1] =
           0x80;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[1].m_data[2] =
           8;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[2].m_data[0] =
           0x1f7;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[2].m_data[1] =
           0x89;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[2].m_data[2] =
           3;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[3].m_data[0] =
           0xb;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[3].m_data[1] =
           0x25;
      createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes[3].m_data[2] =
           3;
      __cxa_guard_release(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                           imageParametersArray);
    }
  }
  if (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::formats == '\0') {
    iVar1 = __cxa_guard_acquire(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                                 formats);
    if (iVar1 != 0) {
      createSparseResourcesShaderIntrinsicsTests::formats[0].order = R;
      createSparseResourcesShaderIntrinsicsTests::formats[0].type = SIGNED_INT32;
      createSparseResourcesShaderIntrinsicsTests::formats[1].order = R;
      createSparseResourcesShaderIntrinsicsTests::formats[1].type = SIGNED_INT16;
      createSparseResourcesShaderIntrinsicsTests::formats[2].order = R;
      createSparseResourcesShaderIntrinsicsTests::formats[2].type = SIGNED_INT8;
      createSparseResourcesShaderIntrinsicsTests::formats[3].order = RGBA;
      createSparseResourcesShaderIntrinsicsTests::formats[3].type = UNSIGNED_INT32;
      createSparseResourcesShaderIntrinsicsTests::formats[4].order = RGBA;
      createSparseResourcesShaderIntrinsicsTests::formats[4].type = UNSIGNED_INT16;
      createSparseResourcesShaderIntrinsicsTests::formats[5].order = RGBA;
      createSparseResourcesShaderIntrinsicsTests::formats[5].type = UNSIGNED_INT8;
      __cxa_guard_release(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::formats);
    }
  }
  if (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                                 functions_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
                 ,"_sparse_fetch",(allocator<char> *)&stream);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                  functions_abi_cxx11_ + 1),"_sparse_read",(allocator<char> *)&local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                  functions_abi_cxx11_ + 2),"_sparse_sample_explicit_lod",
                 (allocator<char> *)&imageTypeGroup);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                  functions_abi_cxx11_ + 3),"_sparse_sample_implicit_lod",
                 (allocator<char> *)&formatGroup);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                  functions_abi_cxx11_ + 4),"_sparse_gather",(allocator<char> *)&imageSize);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                           functions_abi_cxx11_);
    }
  }
  lVar7 = 0;
  do {
    pTVar2 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
             .m_data.ptr;
    if (lVar7 == 5) {
      testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
      .ptr = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&testGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar2;
    }
    local_1c8 = createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
                + lVar7;
    iVar1 = (int)lVar7;
    pIVar5 = createSparseResourcesShaderIntrinsicsTests::imageParametersArray;
    lVar6 = 0;
    while (lVar6 != 5) {
      imageType = createSparseResourcesShaderIntrinsicsTests::imageParametersArray[lVar6].imageType;
      local_1c0 = lVar6;
      pTVar2 = (TestCaseGroup *)operator_new(0x70);
      getImageTypeName_abi_cxx11_(&local_1f0,(sparse *)(ulong)imageType,imageType_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                     &local_1f0,local_1c8);
      tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,_stream,"");
      imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar2;
      std::__cxx11::string::~string((string *)&stream);
      std::__cxx11::string::~string((string *)&local_1f0);
      for (local_1d0 = 0;
          pTVar2 = imageTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, local_1d0 != 6; local_1d0 = local_1d0 + 1) {
        pTVar2 = (TestCaseGroup *)operator_new(0x70);
        format = createSparseResourcesShaderIntrinsicsTests::formats + local_1d0;
        getShaderImageFormatQualifier_abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                   (sparse *)format,format_00);
        tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,_stream,"");
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = pTVar2;
        std::__cxx11::string::~string((string *)&stream);
        for (lVar6 = 4;
            pTVar2 = formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar6 != 0x34; lVar6 = lVar6 + 0xc) {
          tcu::Vector<unsigned_int,_3>::Vector
                    (&imageSize,
                     (Vector<unsigned_int,_3> *)((long)pIVar5->imageSizes[0].m_data + lVar6 + -4));
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&stream);
          poVar3 = std::operator<<(poVar3,"_");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,"_");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          pTVar2 = formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          if (iVar1 - 2U < 3) {
            if (2 < imageType - IMAGE_TYPE_3D) {
              if (iVar1 == 2) {
                pTVar4 = (TestNode *)operator_new(0x90);
                std::__cxx11::stringbuf::str();
                SparseCaseOpImageSparseSampleExplicitLod::SparseCaseOpImageSparseSampleExplicitLod
                          ((SparseCaseOpImageSparseSampleExplicitLod *)pTVar4,testCtx,&local_1f0,
                           SPARSE_SAMPLE_EXPLICIT_LOD,imageType,&imageSize,format);
                tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar4);
              }
              else if (iVar1 == 3) {
                pTVar4 = (TestNode *)operator_new(0x90);
                std::__cxx11::stringbuf::str();
                SparseCaseOpImageSparseSampleImplicitLod::SparseCaseOpImageSparseSampleImplicitLod
                          ((SparseCaseOpImageSparseSampleImplicitLod *)pTVar4,testCtx,&local_1f0,
                           SPARSE_SAMPLE_IMPLICIT_LOD,imageType,&imageSize,format);
                tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar4);
              }
              else {
                pTVar4 = (TestNode *)operator_new(0x90);
                std::__cxx11::stringbuf::str();
                SparseCaseOpImageSparseGather::SparseCaseOpImageSparseGather
                          ((SparseCaseOpImageSparseGather *)pTVar4,testCtx,&local_1f0,SPARSE_GATHER,
                           imageType,&imageSize,format);
                tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar4);
              }
              goto LAB_006e1a5d;
            }
          }
          else {
            if (iVar1 == 0) {
              if (imageType - IMAGE_TYPE_3D < 3) goto LAB_006e1a6f;
              pTVar4 = (TestNode *)operator_new(0x90);
              std::__cxx11::stringbuf::str();
              SparseCaseOpImageSparseFetch::SparseCaseOpImageSparseFetch
                        ((SparseCaseOpImageSparseFetch *)pTVar4,testCtx,&local_1f0,SPARSE_FETCH,
                         imageType,&imageSize,format);
              tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar4);
            }
            else {
              pTVar4 = (TestNode *)operator_new(0x90);
              std::__cxx11::stringbuf::str();
              SparseCaseOpImageSparseRead::SparseCaseOpImageSparseRead
                        ((SparseCaseOpImageSparseRead *)pTVar4,testCtx,&local_1f0,SPARSE_READ,
                         imageType,&imageSize,format);
              tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar4);
            }
LAB_006e1a5d:
            std::__cxx11::string::~string((string *)&local_1f0);
          }
LAB_006e1a6f:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
        }
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = (TestCaseGroup *)0x0;
        tcu::TestNode::addChild
                  (&(imageTypeGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase(&formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      }
      imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(testGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&imageTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      pIVar5 = pIVar5 + 1;
      lVar6 = local_1c0 + 1;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createSparseResourcesShaderIntrinsicsTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "shader_intrinsics", "Sparse Resources Shader Intrinsics"));

	static const deUint32 sizeCountPerImageType = 4u;

	struct ImageParameters
	{
		ImageType	imageType;
		tcu::UVec3	imageSizes[sizeCountPerImageType];
	};

	static const ImageParameters imageParametersArray[] =
	{
		{ IMAGE_TYPE_2D,		{ tcu::UVec3(512u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u), tcu::UVec3(503u, 137u, 1u), tcu::UVec3(11u, 37u, 1u) } },
		{ IMAGE_TYPE_2D_ARRAY,	{ tcu::UVec3(512u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } },
		{ IMAGE_TYPE_CUBE,		{ tcu::UVec3(256u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u),	tcu::UVec3(137u, 137u, 1u),	tcu::UVec3(11u, 11u, 1u) } },
		{ IMAGE_TYPE_CUBE_ARRAY,{ tcu::UVec3(256u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(137u, 137u, 3u),	tcu::UVec3(11u, 11u, 3u) } },
		{ IMAGE_TYPE_3D,		{ tcu::UVec3(256u, 256u, 16u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } }
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT8)
	};

	static const std::string functions[SPARSE_SPIRV_FUNCTION_TYPE_LAST] =
	{
		"_sparse_fetch",
		"_sparse_read",
		"_sparse_sample_explicit_lod",
		"_sparse_sample_implicit_lod",
		"_sparse_gather",
	};

	for (deUint32 functionNdx = 0; functionNdx < SPARSE_SPIRV_FUNCTION_TYPE_LAST; ++functionNdx)
	{
		const SpirVFunction function = static_cast<SpirVFunction>(functionNdx);

		for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray); ++imageTypeNdx)
		{
			const ImageType					imageType = imageParametersArray[imageTypeNdx].imageType;
			de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, (getImageTypeName(imageType) + functions[functionNdx]).c_str(), ""));

			for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
			{
				const tcu::TextureFormat&		format = formats[formatNdx];
				de::MovePtr<tcu::TestCaseGroup> formatGroup(new tcu::TestCaseGroup(testCtx, getShaderImageFormatQualifier(format).c_str(), ""));

				for (deInt32 imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray[imageTypeNdx].imageSizes); ++imageSizeNdx)
				{
					const tcu::UVec3 imageSize = imageParametersArray[imageTypeNdx].imageSizes[imageSizeNdx];

					std::ostringstream stream;
					stream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

					switch (function)
					{
					case SPARSE_FETCH:
						if ((imageType == IMAGE_TYPE_CUBE) || (imageType == IMAGE_TYPE_CUBE_ARRAY)) continue;
					case SPARSE_SAMPLE_EXPLICIT_LOD:
					case SPARSE_SAMPLE_IMPLICIT_LOD:
					case SPARSE_GATHER:
						if ((imageType == IMAGE_TYPE_CUBE) || (imageType == IMAGE_TYPE_CUBE_ARRAY) || (imageType == IMAGE_TYPE_3D)) continue;
						break;
					default:
						break;
					}

					switch (function)
					{
					case SPARSE_FETCH:
						formatGroup->addChild(new SparseCaseOpImageSparseFetch(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_READ:
						formatGroup->addChild(new SparseCaseOpImageSparseRead(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_SAMPLE_EXPLICIT_LOD:
						formatGroup->addChild(new SparseCaseOpImageSparseSampleExplicitLod(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_SAMPLE_IMPLICIT_LOD:
						formatGroup->addChild(new SparseCaseOpImageSparseSampleImplicitLod(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_GATHER:
						formatGroup->addChild(new SparseCaseOpImageSparseGather(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					default:
						DE_ASSERT(0);
						break;
					}
				}
				imageTypeGroup->addChild(formatGroup.release());
			}
			testGroup->addChild(imageTypeGroup.release());
		}
	}

	return testGroup.release();
}